

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setAcceptMode(QFileDialog *this,AcceptMode mode)

{
  bool bVar1;
  undefined4 uVar2;
  QFlagsStorage<QDialogButtonBox::StandardButton> QVar3;
  QFileDialogPrivate *pQVar4;
  QFileDialogOptions *pQVar5;
  Ui_QFileDialog *pUVar6;
  int in_ESI;
  QComboBox *in_RDI;
  QFileDialogPrivate *in_stack_00000010;
  StandardButton button;
  QFileDialogPrivate *d;
  QWidget *in_stack_00000038;
  QFileDialogPrivate *in_stack_00000048;
  QFileDialogPrivate *in_stack_ffffffffffffffd0;
  QDialogButtonBox *this_00;
  undefined1 enable;
  undefined4 in_stack_fffffffffffffff0;
  QComboBox *this_01;
  
  this_01 = in_RDI;
  pQVar4 = d_func((QFileDialog *)0x758e60);
  pQVar5 = QSharedPointer<QFileDialogOptions>::operator->
                     ((QSharedPointer<QFileDialogOptions> *)0x758e76);
  QFileDialogOptions::setAcceptMode((AcceptMode)pQVar5);
  QWidget::setAttribute(in_stack_00000038,this._4_4_,this._3_1_);
  bVar1 = QFileDialogPrivate::usingWidgets(in_stack_ffffffffffffffd0);
  if (bVar1) {
    uVar2 = 0x800;
    if (in_ESI == 0) {
      uVar2 = 0x2000;
    }
    pUVar6 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       (&pQVar4->qFileDialogUi);
    this_00 = pUVar6->buttonBox;
    QVar3.i = (Int)::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
    QDialogButtonBox::setStandardButtons
              (this_00,(QFlagsStorageHelper<QDialogButtonBox::StandardButton,_4>)
                       SUB84((ulong)in_RDI >> 0x20,0));
    enable = (undefined1)((ulong)in_RDI >> 0x38);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&pQVar4->qFileDialogUi);
    QDialogButtonBox::button
              ((QDialogButtonBox *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (StandardButton)((ulong)pQVar4 >> 0x20));
    QWidget::setEnabled((QWidget *)CONCAT44(uVar2,QVar3.i),(bool)enable);
    QFileDialogPrivate::updateOkButton(in_stack_00000048);
    if (in_ESI == 1) {
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                (&pQVar4->qFileDialogUi);
      QComboBox::setEditable(this_01,SUB41((uint)in_ESI >> 0x18,0));
    }
    QFileDialogPrivate::retranslateWindowTitle(in_stack_00000010);
  }
  return;
}

Assistant:

void QFileDialog::setAcceptMode(QFileDialog::AcceptMode mode)
{
    Q_D(QFileDialog);
    d->options->setAcceptMode(static_cast<QFileDialogOptions::AcceptMode>(mode));
    // clear WA_DontShowOnScreen so that d->canBeNativeDialog() doesn't return false incorrectly
    setAttribute(Qt::WA_DontShowOnScreen, false);
    if (!d->usingWidgets())
        return;
    QDialogButtonBox::StandardButton button = (mode == AcceptOpen ? QDialogButtonBox::Open : QDialogButtonBox::Save);
    d->qFileDialogUi->buttonBox->setStandardButtons(button | QDialogButtonBox::Cancel);
    d->qFileDialogUi->buttonBox->button(button)->setEnabled(false);
    d->updateOkButton();
    if (mode == AcceptSave) {
        d->qFileDialogUi->lookInCombo->setEditable(false);
    }
    d->retranslateWindowTitle();
}